

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::timeEnd(ConsoleLogger *this,string *label)

{
  size_type sVar1;
  ostream *poVar2;
  undefined8 *in_RDI;
  rep_conflict rVar3;
  double dVar4;
  duration<double,_std::ratio<1L,_1L>_> seconds;
  time_point now;
  key_type *in_stack_ffffffffffffff08;
  ConsoleLogger *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff20;
  string local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string local_98 [32];
  rep local_78;
  duration<double,_std::ratio<1L,_1L>_> local_70;
  undefined8 local_68;
  string local_50 [32];
  string local_30 [48];
  
  sVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                   *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (sVar1 == 0) {
    std::mutex::lock((mutex *)in_stack_ffffffffffffff10);
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::operator+(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
    warn<std::__cxx11::string>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
    std::mutex::unlock((mutex *)0x10fdab);
  }
  else {
    std::mutex::lock((mutex *)in_stack_ffffffffffffff10);
    local_68 = std::chrono::_V2::system_clock::now();
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                  *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_78 = (rep)std::chrono::operator-
                              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)in_stack_ffffffffffffff18,
                               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)in_stack_ffffffffffffff10);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              (in_stack_ffffffffffffff20,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff18);
    if (*(int *)((long)in_RDI + 0x6c) < 1) {
      poVar2 = (ostream *)*in_RDI;
      std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::operator+(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
      poVar2 = std::operator<<(poVar2,local_98);
      rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_70);
      dVar4 = round(rVar3 * 1000.0);
      in_stack_ffffffffffffff10 = (ConsoleLogger *)std::ostream::operator<<(poVar2,dVar4 * 0.001);
      in_stack_ffffffffffffff08 =
           (key_type *)std::operator<<((ostream *)in_stack_ffffffffffffff10,"s - timer ended");
      std::ostream::operator<<(in_stack_ffffffffffffff08,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
    ::erase((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
             *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::mutex::unlock((mutex *)0x10ffb1);
  }
  return;
}

Assistant:

inline void ConsoleLogger::timeEnd(const std::string& label)
{
	if (!starttimes.count(label))
	{
		mtx.lock();
		warn("Timer \"" + label + "\" doesn't exist.");
		mtx.unlock();
		return;
	}
	mtx.lock();
	auto now = std::chrono::system_clock::now();
	std::chrono::duration<double> seconds = now - starttimes[label];
	if (loglevel <= 0)
		out << "    "+label+": " << 0.001*round(seconds.count()*1000) << "s - timer ended" << std::endl;
	starttimes.erase(label);
	mtx.unlock();
}